

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  allocator local_39;
  string local_38;
  
  iVar4 = -1;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
      if ((this->GraphVizFile)._M_string_length != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Generate graphviz: ");
        poVar2 = std::operator<<(poVar2,(string *)&this->GraphVizFile);
        std::endl<char,std::char_traits<char>>(poVar2);
        GenerateGraphViz(this,(this->GraphVizFile)._M_dataplus._M_p);
      }
      if (this->WarnUnusedCli == true) {
        RunCheckForUnusedVariables(this);
      }
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if ((!bVar1) && (iVar4 = 0, this->CurrentWorkingMode == NORMAL_MODE)) {
        pcVar3 = GetHomeOutputDirectory(this);
        std::__cxx11::string::string((string *)&local_38,pcVar3,&local_39);
        SaveCache(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
  }
  return iVar4;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile.c_str());
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  return 0;
}